

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPAT.cpp
# Opt level: O2

void __thiscall OpenMD::NPAT::scaleSimBox(NPAT *this)

{
  int i;
  long lVar1;
  int j;
  long lVar2;
  double (*this_00) [3];
  double dVar3;
  uint uVar4;
  Mat3x3d scaleMat;
  Mat3x3d hmat;
  SquareMatrix3<double> local_f0;
  RectMatrix<double,_3U,_3U> local_a8;
  RectMatrix<double,_3U,_3U> local_60;
  
  this_00 = (double (*) [3])&local_f0;
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)this_00);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      uVar4 = 0x3ff00000;
      if (lVar1 != lVar2) {
        uVar4 = 0;
      }
      ((RectMatrix<double,_3U,_3U> *)*this_00)->data_[0][lVar2] = (double)((ulong)uVar4 << 0x20);
    }
    this_00 = this_00 + 1;
  }
  dVar3 = exp((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt *
              *(double *)
               ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)this->axis_ * 0x20));
  *(double *)
   ((long)local_f0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   (ulong)this->axis_ * 0x20) = dVar3;
  Snapshot::getHmat((Mat3x3d *)&local_60,
                    (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  operator*((SquareMatrix3<double> *)&local_a8,(SquareMatrix3<double> *)&local_60,&local_f0);
  RectMatrix<double,_3U,_3U>::operator=(&local_60,&local_a8);
  Snapshot::setHmat((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap,
                    (Mat3x3d *)&local_60);
  return;
}

Assistant:

void NPAT::scaleSimBox() {
    Mat3x3d scaleMat;

    for (int i = 0; i < 3; i++) {
      for (int j = 0; j < 3; j++) {
        scaleMat(i, j) = 0.0;
        if (i == j) { scaleMat(i, j) = 1.0; }
      }
    }

    scaleMat(axis_, axis_) = exp(dt * eta(axis_, axis_));
    Mat3x3d hmat           = snap->getHmat();
    hmat                   = hmat * scaleMat;
    snap->setHmat(hmat);
  }